

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::FinalizeAppend
          (RowGroupCollection *this,TransactionData transaction,TableAppendState *state)

{
  idx_t iVar1;
  bool bVar2;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  ColumnStatistics *this_02;
  ColumnStatistics *this_03;
  DistinctStatistics *this_04;
  DistinctStatistics *other;
  ulong uVar3;
  idx_t col_idx;
  idx_t iVar4;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  global_stats_lock;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  local_stats_lock;
  
  iVar1 = this->row_group_size;
  this_01 = state->start_row_group;
  for (iVar4 = state->total_append_count; iVar4 != 0; iVar4 = iVar4 - uVar3) {
    uVar3 = iVar1 - (this_01->super_SegmentBase<duckdb::RowGroup>).count.
                    super___atomic_base<unsigned_long>._M_i;
    if (iVar4 < uVar3) {
      uVar3 = iVar4;
    }
    RowGroup::AppendVersionInfo(this_01,transaction,uVar3);
    this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    this_01 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                        (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,this_01);
  }
  LOCK();
  (this->total_rows).super___atomic_base<unsigned_long>._M_i =
       (this->total_rows).super___atomic_base<unsigned_long>._M_i + state->total_append_count;
  UNLOCK();
  state->total_append_count = 0;
  state->start_row_group = (RowGroup *)0x0;
  TableStatistics::GetLock((TableStatistics *)&local_stats_lock);
  other = (DistinctStatistics *)&this->stats;
  TableStatistics::GetLock((TableStatistics *)&global_stats_lock);
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->types).
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->types).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
    ::operator*(&global_stats_lock);
    this_02 = TableStatistics::GetStats(&this->stats,(TableStatisticsLock *)other,uVar3);
    bVar2 = ColumnStatistics::HasDistinctStats(this_02);
    if (bVar2) {
      unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
      ::operator*(&local_stats_lock);
      this_03 = TableStatistics::GetStats(&state->stats,(TableStatisticsLock *)other,uVar3);
      bVar2 = ColumnStatistics::HasDistinctStats(this_03);
      if (bVar2) {
        this_04 = ColumnStatistics::DistinctStats(this_02);
        other = ColumnStatistics::DistinctStats(this_03);
        DistinctStatistics::Merge(this_04,other);
      }
    }
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&global_stats_lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&local_stats_lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  return;
}

Assistant:

void RowGroupCollection::FinalizeAppend(TransactionData transaction, TableAppendState &state) {
	const idx_t row_group_size = GetRowGroupSize();

	auto remaining = state.total_append_count;
	auto row_group = state.start_row_group;
	while (remaining > 0) {
		auto append_count = MinValue<idx_t>(remaining, row_group_size - row_group->count);
		row_group->AppendVersionInfo(transaction, append_count);
		remaining -= append_count;
		row_group = row_groups->GetNextSegment(row_group);
	}
	total_rows += state.total_append_count;

	state.total_append_count = 0;
	state.start_row_group = nullptr;

	auto local_stats_lock = state.stats.GetLock();
	auto global_stats_lock = stats.GetLock();
	for (idx_t col_idx = 0; col_idx < types.size(); col_idx++) {
		auto &global_stats = stats.GetStats(*global_stats_lock, col_idx);
		if (!global_stats.HasDistinctStats()) {
			continue;
		}
		auto &local_stats = state.stats.GetStats(*local_stats_lock, col_idx);
		if (!local_stats.HasDistinctStats()) {
			continue;
		}
		global_stats.DistinctStats().Merge(local_stats.DistinctStats());
	}

	Verify();
}